

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void sysbvm_array_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_context_t *context_local;
  
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).arrayType,"=",2,4,(void *)0x0,sysbvm_array_primitive_equals);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).arrayType,"hash",1,4,(void *)0x0,sysbvm_array_primitive_hash);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).byteArrayType,"copyFrom:until:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_copyFromUntil);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).byteArrayType,"replaceBytesFrom:count:with:startingAt:",5,0x14
             ,(void *)0x0,sysbvm_byteArray_primitive_replaceBytesFromWith);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringType,"replaceBytesFrom:count:with:startingAt:",5,0x14,
             (void *)0x0,sysbvm_byteArray_primitive_replaceBytesFromWith);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__char8At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_char8At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__uint8At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_uint8At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__int8At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_int8At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__char16At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_char16At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__uint16At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_uint16At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__int16At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_int16At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__char32At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_char32At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__uint32At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_uint32At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__int32At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_int32At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__uint64At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_uint64At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__int64At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_int64At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__float32At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_float32At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__float64At__:",2,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_float64At);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__char8At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_char8AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__uint8At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_uint8AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__int8At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_int8AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__char16At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_char16AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__uint16At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_uint16AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__int16At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_int16AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__char32At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_char32AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__uint32At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_uint32AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__int32At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_int32AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__uint64At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_uint64AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__int64At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_int64AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__float32At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_float32AtPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"__float64At__:put:",3,0x14,(void *)0x0,
             sysbvm_byteArray_primitive_float64AtPut);
  return;
}

Assistant:

void sysbvm_array_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.arrayType, "=", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_array_primitive_equals);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.arrayType, "hash", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_array_primitive_hash);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.byteArrayType, "copyFrom:until:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_copyFromUntil);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.byteArrayType, "replaceBytesFrom:count:with:startingAt:", 5, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_replaceBytesFromWith);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringType, "replaceBytesFrom:count:with:startingAt:", 5, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_replaceBytesFromWith);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__char8At__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_char8At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__uint8At__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_uint8At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__int8At__:" , 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_int8At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__char16At__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_char16At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__uint16At__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_uint16At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__int16At__:" , 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_int16At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__char32At__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_char32At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__uint32At__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_uint32At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__int32At__:" , 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_int32At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__uint64At__:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_uint64At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__int64At__:" , 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_int64At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__float32At__:" , 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_float32At);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__float64At__:" , 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_float64At);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__char8At__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_char8AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__uint8At__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_uint8AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__int8At__:put:" , 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_int8AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__char16At__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_char16AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__uint16At__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_uint16AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__int16At__:put:" , 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_int16AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__char32At__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_char32AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__uint32At__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_uint32AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__int32At__:put:" , 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_int32AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__uint64At__:put:", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_uint64AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__int64At__:put:" , 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_int64AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__float32At__:put:" , 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_float32AtPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "__float64At__:put:" , 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_byteArray_primitive_float64AtPut);
}